

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

void __thiscall
BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
          (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          cmListFileBacktrace *bt)

{
  cmListFileBacktrace *bt_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)v);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,bt);
  return;
}

Assistant:

BT(T v = T(), cmListFileBacktrace bt = cmListFileBacktrace())
    : Value(std::move(v))
    , Backtrace(std::move(bt))
  {
  }